

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void walEncodeFrame(Wal *pWal,u32 iPage,u32 nTruncate,u8 *aData,u8 *aFrame)

{
  uint nativeCksum_00;
  u32 *aIn;
  u8 *in_RCX;
  u32 in_EDX;
  u32 in_ESI;
  long in_RDI;
  uchar *in_R8;
  u32 *aCksum;
  int nativeCksum;
  
  aIn = (u32 *)(in_RDI + 0x60);
  sqlite3Put4byte(in_R8,in_ESI);
  sqlite3Put4byte(in_R8 + 4,in_EDX);
  if (*(int *)(in_RDI + 0x7c) == 0) {
    *(undefined8 *)(in_R8 + 8) = *(undefined8 *)(in_RDI + 0x68);
    nativeCksum_00 = (uint)(*(char *)(in_RDI + 0x55) == '\0');
    walChecksumBytes(nativeCksum_00,in_R8,8,aIn,aIn);
    walChecksumBytes(nativeCksum_00,in_RCX,*(int *)(in_RDI + 0x38),aIn,aIn);
    sqlite3Put4byte(in_R8 + 0x10,*aIn);
    sqlite3Put4byte(in_R8 + 0x14,*(u32 *)(in_RDI + 100));
  }
  else {
    memset(in_R8 + 8,0,0x10);
  }
  return;
}

Assistant:

static void walEncodeFrame(
  Wal *pWal,                      /* The write-ahead log */
  u32 iPage,                      /* Database page number for frame */
  u32 nTruncate,                  /* New db size (or 0 for non-commit frames) */
  u8 *aData,                      /* Pointer to page data */
  u8 *aFrame                      /* OUT: Write encoded frame here */
){
  int nativeCksum;                /* True for native byte-order checksums */
  u32 *aCksum = pWal->hdr.aFrameCksum;
  assert( WAL_FRAME_HDRSIZE==24 );
  sqlite3Put4byte(&aFrame[0], iPage);
  sqlite3Put4byte(&aFrame[4], nTruncate);
  if( pWal->iReCksum==0 ){
    memcpy(&aFrame[8], pWal->hdr.aSalt, 8);

    nativeCksum = (pWal->hdr.bigEndCksum==SQLITE_BIGENDIAN);
    walChecksumBytes(nativeCksum, aFrame, 8, aCksum, aCksum);
    walChecksumBytes(nativeCksum, aData, pWal->szPage, aCksum, aCksum);

    sqlite3Put4byte(&aFrame[16], aCksum[0]);
    sqlite3Put4byte(&aFrame[20], aCksum[1]);
  }else{
    memset(&aFrame[8], 0, 16);
  }
}